

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O2

int Gia_ManCheckUnate(Gia_Man_t *p,int iCiId,int iCoId)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = Gia_ManCi(p,iCiId);
  iVar1 = Gia_ObjId(p,pGVar5);
  pGVar5 = Gia_ManCo(p,iCoId);
  iVar2 = Gia_ObjId(p,pGVar5);
  pGVar5 = Gia_ManCo(p,iCoId);
  Gia_ManIncrementTravId(p);
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc <= iVar1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x260,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  p->pTravIds[iVar1] = p->nTravIds;
  Gia_ManIncrementTravId(p);
  Gia_ManIncrementTravId(p);
  uVar3 = Gia_ManCheckUnate_rec(p,iVar2 - (*(uint *)pGVar5 & 0x1fffffff));
  uVar4 = uVar3;
  if ((uVar3 - 1 < 2) && (uVar4 = uVar3 ^ 3, (pGVar5->field_0x3 & 0x20) == 0)) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

int Gia_ManCheckUnate( Gia_Man_t * p, int iCiId, int iCoId )
{
    int Res;
    int CiObjId = Gia_ObjId(p, Gia_ManCi(p, iCiId));
    int CoObjId = Gia_ObjId(p, Gia_ManCo(p, iCoId));
    Gia_Obj_t * pCoObj = Gia_ManCo(p, iCoId);
    Gia_ManIncrementTravId( p ); // Co does not depend on Ci.
    Gia_ManIncrementTravId( p ); // Co is pos-unate in Ci
    Gia_ObjSetTravIdCurrentId( p, CiObjId );
    Gia_ManIncrementTravId( p ); // Co is neg-unate in Ci
    Gia_ManIncrementTravId( p ); // Co is not unate in Ci
    Res = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId0(pCoObj, CoObjId) );
    return ((Res == 1 || Res == 2) && Gia_ObjFaninC0(pCoObj)) ? Res ^ 3 : Res;
}